

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType0.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::GridDataType0::Encode(GridDataType0 *this,KDataStream *stream)

{
  bool bVar1;
  reference puVar2;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  GridDataType0 *this_local;
  
  GridData::Encode(&this->super_GridData,stream);
  KDataStream::operator<<(stream,*(unsigned_short *)&(this->super_GridData).field_0xc);
  citrEnd = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->m_vui8DataVals)
  ;
  local_28._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          (&this->m_vui8DataVals);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&citrEnd);
    KDataStream::operator<<(stream,*puVar2);
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&citrEnd);
  }
  if ((uint)*(ushort *)&(this->super_GridData).field_0xc % 2 == 1) {
    KDataStream::operator<<(stream,this->m_ui8Padding);
  }
  return;
}

Assistant:

void GridDataType0::Encode( KDataStream & stream ) const
{
    GridData::Encode( stream );

    stream << m_ui16NumBytes;

    vector<KUINT8>::const_iterator citr = m_vui8DataVals.begin();
    vector<KUINT8>::const_iterator citrEnd = m_vui8DataVals.end();
    for( ; citr != citrEnd; ++citr )
    {
        stream << *citr;
    }

    // Should we add some padding onto the end? We need to have a 16 bit alignment.
    if( m_ui16NumBytes % 2 == 1 )
    {
        stream << m_ui8Padding;
    }
}